

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O2

sexp analyze_var_ref(sexp ctx,sexp x,sexp_conflict *varenv)

{
  sexp_tag_t sVar1;
  sexp cell_00;
  sexp psVar2;
  sexp cell;
  sexp local_40;
  sexp_gc_var_t local_38;
  
  psVar2 = (ctx->value).type.cpl;
  local_38.var = &local_40;
  local_40 = (sexp)0x43e;
  local_38.next = (ctx->value).context.saves;
  (ctx->value).context.saves = &local_38;
  cell_00 = sexp_env_cell_loc(ctx,psVar2,x,0,varenv);
  if ((cell_00 == (sexp)0x0) &&
     (local_40 = cell_00, cell_00 = sexp_env_cell_loc(ctx,psVar2,x,0,varenv), cell_00 == (sexp)0x0))
  {
    cell_00 = sexp_env_cell_define(ctx,psVar2,x,(sexp)&DAT_0000053e,varenv);
  }
  psVar2 = (cell_00->value).type.cpl;
  local_40 = cell_00;
  if ((((ulong)psVar2 & 3) == 0) && ((sVar1 = psVar2->tag, sVar1 == 0x19 || (sVar1 == 0x15)))) {
    psVar2 = sexp_compile_error(ctx,"invalid use of syntax as value",x);
  }
  else {
    psVar2 = sexp_make_ref(ctx,(cell_00->value).type.name,cell_00);
  }
  (ctx->value).context.saves = local_38.next;
  return psVar2;
}

Assistant:

static sexp analyze_var_ref (sexp ctx, sexp x, sexp *varenv) {
  sexp env = sexp_context_env(ctx), res;
  sexp_gc_var1(cell);
  sexp_gc_preserve1(ctx, cell);
  cell = sexp_env_cell_loc(ctx, env, x, 0, varenv);
  if (! cell) {
    cell = sexp_env_cell_create(ctx, env, x, SEXP_UNDEF, varenv);
  }
  if (sexp_macrop(sexp_cdr(cell)) || sexp_corep(sexp_cdr(cell))) {
    res = sexp_compile_error(ctx, "invalid use of syntax as value", x);
  } else {
    res = sexp_make_ref(ctx, sexp_car(cell), cell);
  }
  sexp_gc_release1(ctx);
  return res;
}